

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContextInit.cpp
# Opt level: O0

int64_t Imf_3_4::istream_nonparallel_read
                  (exr_const_context_t ctxt,void *userdata,void *buffer,uint64_t sz,uint64_t offset,
                  exr_stream_error_func_ptr_t error_cb)

{
  long *plVar1;
  byte bVar2;
  long lVar3;
  void *__src;
  ulong in_RCX;
  void *in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  long in_R8;
  code *in_R9;
  exception *e;
  char *data;
  int64_t nend;
  int64_t stream_sz;
  int64_t nread;
  lock_guard<std::mutex> lk;
  IStream *s;
  istream_holder *ih;
  mutex_type *in_stack_ffffffffffffff28;
  lock_guard<std::mutex> *in_stack_ffffffffffffff30;
  long local_58;
  ulong local_28;
  long local_8;
  
  plVar1 = *(long **)(in_RSI + 0x28);
  if (0x7fffffff < in_RCX) {
    (*in_R9)(in_RDI,10,"Stream interface request to read block too large");
    return -1;
  }
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  local_58 = (**(code **)(*plVar1 + 0x28))();
  if (in_R8 != local_58) {
    (**(code **)(*plVar1 + 0x30))(plVar1,in_R8);
    local_58 = (**(code **)(*plVar1 + 0x28))();
    if (in_R8 != local_58) {
      (*in_R9)(in_RDI,10,"Unable to seek to desired offset %lu",in_R8);
      local_8 = -1;
      goto LAB_00199dc4;
    }
  }
  lVar3 = (**(code **)(*plVar1 + 0x40))();
  local_28 = in_RCX;
  if ((0 < lVar3) && (lVar3 < (long)(local_58 + in_RCX))) {
    local_28 = lVar3 - (local_58 + in_RCX);
  }
  bVar2 = (**(code **)(*plVar1 + 0x10))();
  if ((bVar2 & 1) == 0) {
    (**(code **)(*plVar1 + 0x18))(plVar1,in_RDX,local_28 & 0xffffffff);
  }
  else {
    __src = (void *)(**(code **)(*plVar1 + 0x20))(plVar1,local_28 & 0xffffffff);
    if (__src != (void *)0x0) {
      memcpy(in_RDX,__src,local_28);
    }
  }
  local_8 = (**(code **)(*plVar1 + 0x28))();
  local_8 = local_8 - local_58;
LAB_00199dc4:
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x199dd1);
  return local_8;
}

Assistant:

static int64_t
istream_nonparallel_read (
    exr_const_context_t         ctxt,
    void*                       userdata,
    void*                       buffer,
    uint64_t                    sz,
    uint64_t                    offset,
    exr_stream_error_func_ptr_t error_cb)
{
    istream_holder* ih = static_cast<istream_holder*> (userdata);
    IStream*        s  = ih->_stream;

    if (sz > INT_MAX)
    {
        error_cb (
            ctxt,
            EXR_ERR_READ_IO,
            "Stream interface request to read block too large");
        return -1;
    }

#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lk{ih->_mx};
#endif

    int64_t         nread = s->tellg ();
    try
    {
        if (offset != static_cast<size_t> (nread))
        {
            s->seekg (offset);
            nread = s->tellg ();
            if (offset != static_cast<size_t> (nread))
            {
                error_cb (
                    ctxt,
                    EXR_ERR_READ_IO,
                    "Unable to seek to desired offset %" PRIu64,
                    offset);
                return -1;
            }
        }

        int64_t stream_sz = s->size ();
        int64_t nend = nread + (int64_t)sz;
        if (stream_sz > 0 && nend > stream_sz)
        {
            sz = stream_sz - nend;
        }

        try
        {
            if (s->isMemoryMapped ())
            {
                char* data = s->readMemoryMapped (static_cast<int> (sz));
                // TODO: in a future release, pass this through to
                // core directly
                if (data)
                    memcpy (buffer, data, sz);
            }
            else
            {
                s->read (static_cast<char*> (buffer), static_cast<int> (sz));
            }
        }
        catch (...)
        {
            // bah, there could be two reasons for this, one is a
            // legitimate error, the other is a read past the end of file
            // (i.e. the core library tries to read a 4k block when
            // parsing the header), let's let the core deal with that and
            // clear errors
            ih->_stream->clear ();
            //error_cb (
            //    ctxt,
            //    EXR_ERR_READ_IO,
            //    "Unable to read requested bytes: %" PRIu64,
            //    sz);
        }
        nread = s->tellg () - nread;
    }
    catch (std::exception &e)
    {
        error_cb (
            ctxt,
            EXR_ERR_READ_IO,
            "Unable to seek to desired offset %" PRIu64 ": %s",
            offset,
            e.what());
        nread = -1;
    }
    catch (...)
    {
        error_cb (
            ctxt,
            EXR_ERR_READ_IO,
            "Unable to seek to desired offset %" PRIu64 ": Unknown error",
            offset);
        nread = -1;
    }
    return nread;
}